

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

void __thiscall MyGame::Example::AnyUnion::AnyUnion(AnyUnion *this,AnyUnion *u)

{
  Any AVar1;
  MonsterT *this_00;
  undefined1 *puVar2;
  void *pvVar3;
  AnyUnion *u_local;
  AnyUnion *this_local;
  
  this->type = u->type;
  this->value = (void *)0x0;
  AVar1 = this->type;
  if (AVar1 == Any_Monster) {
    this_00 = (MonsterT *)operator_new(800);
    MonsterT::MonsterT(this_00,(MonsterT *)u->value);
    this->value = this_00;
  }
  else if (AVar1 == Any_TestSimpleTableWithEnum) {
    puVar2 = (undefined1 *)operator_new(1);
    *puVar2 = *u->value;
    this->value = puVar2;
  }
  else if (AVar1 == Any_MAX) {
    pvVar3 = operator_new(1);
    this->value = pvVar3;
  }
  return;
}

Assistant:

inline AnyUnion::AnyUnion(const AnyUnion &u) : type(u.type), value(nullptr) {
  switch (type) {
    case Any_Monster: {
      value = new MyGame::Example::MonsterT(*reinterpret_cast<MyGame::Example::MonsterT *>(u.value));
      break;
    }
    case Any_TestSimpleTableWithEnum: {
      value = new MyGame::Example::TestSimpleTableWithEnumT(*reinterpret_cast<MyGame::Example::TestSimpleTableWithEnumT *>(u.value));
      break;
    }
    case Any_MyGame_Example2_Monster: {
      value = new MyGame::Example2::MonsterT(*reinterpret_cast<MyGame::Example2::MonsterT *>(u.value));
      break;
    }
    default:
      break;
  }
}